

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

string * ParseEvent_abi_cxx11_(string *__return_storage_ptr__,istream *is)

{
  istream *piVar1;
  istream *is_local;
  string *event;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  piVar1 = (istream *)std::istream::operator>>(is,std::ws<char,std::char_traits<char>>);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            (piVar1,(string *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string ParseEvent(istream& is) {
    string event;
    getline(is >> ws, event);
    return event;
}